

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpplocate.cpp
# Opt level: O1

string * cpplocate::locatePath
                   (string *__return_storage_ptr__,string *relPath,string *systemDir,void *symbol)

{
  uint relPathLength;
  uint length;
  char *path;
  uint local_24;
  _anonymous_namespace_ *local_20;
  
  local_20 = (_anonymous_namespace_ *)0x0;
  local_24 = 0;
  relPathLength = (uint)relPath->_M_string_length;
  ::locatePath((char **)&local_20,&local_24,(relPath->_M_dataplus)._M_p,relPathLength,
               (systemDir->_M_dataplus)._M_p,(uint)systemDir->_M_string_length,symbol);
  (anonymous_namespace)::obtainStringFromLibLocate_abi_cxx11_
            (__return_storage_ptr__,local_20,(char *)(ulong)local_24,relPathLength);
  return __return_storage_ptr__;
}

Assistant:

std::string locatePath(const std::string & relPath, const std::string & systemDir, void * symbol)
{
    char * path = nullptr;
    unsigned int length = 0;

    ::locatePath(&path, &length, relPath.c_str(), (unsigned int)relPath.size(), systemDir.c_str(), (unsigned int)systemDir.size(), symbol);

    // Convert to string and free memory from liblocate
    return obtainStringFromLibLocate(path, length);
}